

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_bool j2k_read_siz_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  opj_image_t *p_image_header;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  opj_image_comp_t *__s;
  opj_tcp_v2_t *__s_00;
  opj_tccp_t *poVar6;
  opj_mct_data_t *poVar7;
  opj_simple_mcc_decorrelation_data_t *poVar8;
  OPJ_UINT32 *pOVar9;
  uint uVar10;
  char *fmt;
  uint uVar11;
  ulong __nmemb;
  size_t __size;
  uint uVar12;
  long lVar13;
  uint uVar14;
  OPJ_BYTE *p_buffer;
  opj_tccp_t **ppoVar15;
  OPJ_UINT32 tmp;
  OPJ_UINT32 l_tmp;
  uint local_4c;
  OPJ_UINT32 *local_48;
  OPJ_UINT32 *local_40;
  OPJ_RSIZ_CAPABILITIES local_34;
  
  if ((p_header_size < 0x24) || (0x55555555 < (p_header_size - 0x24) * -0x55555555)) {
    fmt = "Error with SIZ marker size\n";
  }
  else {
    p_image_header = p_j2k->m_private_image;
    opj_read_bytes_LE(p_header_data,&local_34,2);
    (p_j2k->m_cp).rsiz = local_34;
    local_48 = &p_image_header->x1;
    opj_read_bytes_LE(p_header_data + 2,local_48,4);
    local_40 = &p_image_header->y1;
    opj_read_bytes_LE(p_header_data + 6,local_40,4);
    opj_read_bytes_LE(p_header_data + 10,&p_image_header->x0,4);
    opj_read_bytes_LE(p_header_data + 0xe,&p_image_header->y0,4);
    opj_read_bytes_LE(p_header_data + 0x12,&(p_j2k->m_cp).tdx,4);
    opj_read_bytes_LE(p_header_data + 0x16,&(p_j2k->m_cp).tdy,4);
    opj_read_bytes_LE(p_header_data + 0x1a,&(p_j2k->m_cp).tx0,4);
    opj_read_bytes_LE(p_header_data + 0x1e,&(p_j2k->m_cp).ty0,4);
    opj_read_bytes_LE(p_header_data + 0x22,&local_34,2);
    __nmemb = (ulong)local_34;
    if (0x4000 < __nmemb) {
      opj_event_msg_v2(p_manager,1,"Error with SIZ marker: number of component is illegal -> %d\n",
                       __nmemb);
      return 0;
    }
    p_image_header->numcomps = local_34;
    if (local_34 != (p_header_size - 0x24) / 3) {
      opj_event_msg_v2(p_manager,1,
                       "Error with SIZ marker: number of component is not compatible with the remaining number of parameters ( %d vs %d)\n"
                       ,(ulong)local_34);
      return 0;
    }
    __s = (opj_image_comp_t *)calloc(__nmemb,0x38);
    p_image_header->comps = __s;
    if (__s == (opj_image_comp_t *)0x0) {
      p_image_header->numcomps = 0;
    }
    else {
      uVar11 = 0;
      memset(__s,0,__nmemb * 0x38);
      if (p_image_header->numcomps != 0) {
        p_buffer = p_header_data + 0x24;
        pOVar9 = &p_image_header->comps->factor;
        do {
          opj_read_bytes_LE(p_buffer,&local_4c,1);
          pOVar9[-4] = (local_4c & 0x7f) + 1;
          pOVar9[-2] = local_4c >> 7;
          opj_read_bytes_LE(p_buffer + 1,&local_4c,1);
          ((opj_image_comp_t *)(pOVar9 + -10))->dx = local_4c;
          opj_read_bytes_LE(p_buffer + 2,&local_4c,1);
          pOVar9[-9] = local_4c;
          pOVar9[-1] = 0;
          *pOVar9 = (p_j2k->m_cp).m_specific_param.m_dec.m_reduce;
          uVar11 = uVar11 + 1;
          pOVar9 = pOVar9 + 0xe;
          p_buffer = p_buffer + 3;
        } while (uVar11 < p_image_header->numcomps);
      }
      uVar11 = (p_j2k->m_cp).tx0;
      uVar1 = (p_j2k->m_cp).ty0;
      uVar2 = (p_j2k->m_cp).tdx;
      uVar10 = ~uVar11;
      OVar4 = (int)(*local_48 + uVar10 + uVar2) / (int)uVar2;
      (p_j2k->m_cp).tw = OVar4;
      uVar3 = (p_j2k->m_cp).tdy;
      uVar12 = ~uVar1;
      OVar5 = (int)(*local_40 + uVar12 + uVar3) / (int)uVar3;
      (p_j2k->m_cp).th = OVar5;
      uVar14 = OVar5 * OVar4;
      if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 2) == 0) {
        *(undefined8 *)((long)&p_j2k->m_specific_param + 0x20) = 0;
        (p_j2k->m_specific_param).m_decoder.m_end_tile_x = OVar4;
      }
      else {
        (p_j2k->m_specific_param).m_decoder.m_start_tile_x =
             ((p_j2k->m_specific_param).m_decoder.m_start_tile_x - uVar11) / uVar2;
        (p_j2k->m_specific_param).m_decoder.m_start_tile_y =
             ((p_j2k->m_specific_param).m_decoder.m_start_tile_y - uVar1) / uVar3;
        (p_j2k->m_specific_param).m_decoder.m_end_tile_x =
             (int)(uVar10 + uVar2 + (p_j2k->m_specific_param).m_decoder.m_end_tile_x) / (int)uVar2;
        OVar5 = (int)(uVar12 + uVar3 + (p_j2k->m_specific_param).m_decoder.m_end_tile_y) /
                (int)uVar3;
      }
      (p_j2k->m_specific_param).m_decoder.m_end_tile_y = OVar5;
      __s_00 = (opj_tcp_v2_t *)calloc((ulong)uVar14,0x1630);
      (p_j2k->m_cp).tcps = __s_00;
      if (__s_00 != (opj_tcp_v2_t *)0x0) {
        memset(__s_00,0,(ulong)uVar14 * 0x15e8);
        uVar11 = p_image_header->numcomps;
        poVar6 = (opj_tccp_t *)calloc((ulong)uVar11,0x438);
        ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->tccps = poVar6;
        poVar6 = ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->tccps;
        if (poVar6 != (opj_tccp_t *)0x0) {
          memset(poVar6,0,(ulong)uVar11 * 0x438);
          poVar7 = (opj_mct_data_t *)malloc(0x140);
          ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->m_mct_records = poVar7;
          poVar7 = ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->m_mct_records;
          if (poVar7 != (opj_mct_data_t *)0x0) {
            memset(poVar7,0,0x140);
            ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->m_nb_max_mct_records = 10;
            poVar8 = (opj_simple_mcc_decorrelation_data_t *)malloc(0x140);
            ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->m_mcc_records = poVar8;
            poVar8 = ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->m_mcc_records;
            if (poVar8 != (opj_simple_mcc_decorrelation_data_t *)0x0) {
              memset(poVar8,0,0x140);
              ((p_j2k->m_specific_param).m_decoder.m_default_tcp)->m_nb_max_mcc_records = 10;
              uVar11 = p_image_header->numcomps;
              if ((ulong)uVar11 != 0) {
                pOVar9 = &p_image_header->comps->sgnd;
                lVar13 = 0;
                do {
                  if (*pOVar9 == 0) {
                    *(int *)((long)&((p_j2k->m_specific_param).m_decoder.m_default_tcp)->tccps->
                                    m_dc_level_shift + lVar13) = 1 << ((char)pOVar9[-2] - 1U & 0x1f)
                    ;
                  }
                  pOVar9 = pOVar9 + 0xe;
                  lVar13 = lVar13 + 0x438;
                } while ((ulong)uVar11 * 0x438 - lVar13 != 0);
              }
              if (uVar14 != 0) {
                ppoVar15 = &((p_j2k->m_cp).tcps)->tccps;
                do {
                  __size = (ulong)p_image_header->numcomps * 0x438;
                  poVar6 = (opj_tccp_t *)malloc(__size);
                  *ppoVar15 = poVar6;
                  if (poVar6 == (opj_tccp_t *)0x0) goto LAB_001eeda2;
                  memset(poVar6,0,__size);
                  ppoVar15 = ppoVar15 + 0x2c6;
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
              }
              (p_j2k->m_specific_param).m_decoder.m_state = 4;
              opj_image_comp_header_update(p_image_header,&p_j2k->m_cp);
              return 1;
            }
          }
        }
      }
    }
LAB_001eeda2:
    fmt = "Not enough memory to take in charge SIZ marker\n";
  }
  opj_event_msg_v2(p_manager,1,fmt);
  return 0;
}

Assistant:

opj_bool j2k_read_siz_v2 (
				    opj_j2k_v2_t *p_j2k,
					OPJ_BYTE * p_header_data,
					OPJ_UINT32 p_header_size,
					struct opj_event_mgr * p_manager
					)
{
	OPJ_UINT32 l_size, i;
	OPJ_UINT32 l_nb_comp;
	OPJ_UINT32 l_nb_comp_remain;
	OPJ_UINT32 l_remaining_size;
	OPJ_UINT32 l_nb_tiles;
	OPJ_UINT32 l_tmp;
	opj_image_t *l_image = 00;
	opj_cp_v2_t *l_cp = 00;
	opj_image_comp_t * l_img_comp = 00;
	opj_tcp_v2_t * l_current_tile_param = 00;

	/* preconditions */
	assert(p_j2k != 00);
	assert(p_manager != 00);
	assert(p_header_data != 00);

	l_image = p_j2k->m_private_image;
	l_cp = &(p_j2k->m_cp);

	/* minimum size == 39 - 3 (= minimum component parameter) */
	if (p_header_size < 36) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with SIZ marker size\n");
		return OPJ_FALSE;
	}

	l_remaining_size = p_header_size - 36;
	l_nb_comp = l_remaining_size / 3;
	l_nb_comp_remain = l_remaining_size % 3;
	if (l_nb_comp_remain != 0){
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with SIZ marker size\n");
		return OPJ_FALSE;
	}

	l_size = p_header_size + 2;										/* Lsiz */

	opj_read_bytes(p_header_data,&l_tmp ,2);						/* Rsiz (capabilities) */
	p_header_data+=2;
	l_cp->rsiz = (OPJ_RSIZ_CAPABILITIES) l_tmp;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_image->x1, 4);	/* Xsiz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_image->y1, 4);	/* Ysiz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_image->x0, 4);	/* X0siz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_image->y0, 4);	/* Y0siz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_cp->tdx, 4);		/* XTsiz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_cp->tdy, 4);		/* YTsiz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_cp->tx0, 4);		/* XT0siz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_cp->ty0, 4);		/* YT0siz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_tmp, 2);			/* Csiz */
	p_header_data+=2;
	if (l_tmp < 16385)
		l_image->numcomps = (OPJ_UINT16) l_tmp;
	else {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with SIZ marker: number of component is illegal -> %d\n", l_tmp);
		return OPJ_FALSE;
	}

	if (l_image->numcomps != l_nb_comp) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with SIZ marker: number of component is not compatible with the remaining number of parameters ( %d vs %d)\n", l_image->numcomps, l_nb_comp);
		return OPJ_FALSE;
	}

#ifdef USE_JPWL
	if (l_cp->correct) {
		/* if JPWL is on, we check whether TX errors have damaged
		  too much the SIZ parameters */
		if (!(l_image->x1 * l_image->y1)) {
			opj_event_msg_v2(p_manager, EVT_ERROR,
				"JPWL: bad image size (%d x %d)\n",
				l_image->x1, l_image->y1);
			if (!JPWL_ASSUME || JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
		}

	/* FIXME check previously in the function so why keep this piece of code ? Need by the norm ?
		if (l_image->numcomps != ((len - 38) / 3)) {
			opj_event_msg_v2(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
				"JPWL: Csiz is %d => space in SIZ only for %d comps.!!!\n",
				l_image->numcomps, ((len - 38) / 3));
			if (!JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
	*/		/* we try to correct */
	/*		opj_event_msg_v2(p_manager, EVT_WARNING, "- trying to adjust this\n");
			if (l_image->numcomps < ((len - 38) / 3)) {
				len = 38 + 3 * l_image->numcomps;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- setting Lsiz to %d => HYPOTHESIS!!!\n",
					len);
			} else {
				l_image->numcomps = ((len - 38) / 3);
				opj_event_msg_v2(p_manager, EVT_WARNING, "- setting Csiz to %d => HYPOTHESIS!!!\n",
					l_image->numcomps);
			}
		}
	*/

		/* update components number in the jpwl_exp_comps filed */
		l_cp->exp_comps = l_image->numcomps;
	}
#endif /* USE_JPWL */

	/* Allocate the resulting image components */
	l_image->comps = (opj_image_comp_t*) opj_calloc(l_image->numcomps, sizeof(opj_image_comp_t));
	if (l_image->comps == 00){
		l_image->numcomps = 0;
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}

	memset(l_image->comps,0,l_image->numcomps * sizeof(opj_image_comp_t));
	l_img_comp = l_image->comps;

	/* Read the component information */
	for (i = 0; i < l_image->numcomps; ++i){
		OPJ_UINT32 tmp;
		opj_read_bytes(p_header_data,&tmp,1);	/* Ssiz_i */
		++p_header_data;
		l_img_comp->prec = (tmp & 0x7f) + 1;
		l_img_comp->sgnd = tmp >> 7;
		opj_read_bytes(p_header_data,&tmp,1);	/* XRsiz_i */
		++p_header_data;
		l_img_comp->dx = (OPJ_INT32)tmp; /* should be between 1 and 255 */
		opj_read_bytes(p_header_data,&tmp,1);	/* YRsiz_i */
		++p_header_data;
		l_img_comp->dy = (OPJ_INT32)tmp; /* should be between 1 and 255 */

#ifdef USE_JPWL
		if (l_cp->correct) {
		/* if JPWL is on, we check whether TX errors have damaged
			too much the SIZ parameters, again */
			if (!(l_image->comps[i].dx * l_image->comps[i].dy)) {
				opj_event_msg_v2(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
					"JPWL: bad XRsiz_%d/YRsiz_%d (%d x %d)\n",
					i, i, l_image->comps[i].dx, l_image->comps[i].dy);
				if (!JPWL_ASSUME) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
					return OPJ_FALSE;
				}
				/* we try to correct */
				opj_event_msg_v2(p_manager, EVT_WARNING, "- trying to adjust them\n");
				if (!l_image->comps[i].dx) {
					l_image->comps[i].dx = 1;
					opj_event_msg_v2(p_manager, EVT_WARNING, "- setting XRsiz_%d to %d => HYPOTHESIS!!!\n",
						i, l_image->comps[i].dx);
				}
				if (!l_image->comps[i].dy) {
					l_image->comps[i].dy = 1;
					opj_event_msg_v2(p_manager, EVT_WARNING, "- setting YRsiz_%d to %d => HYPOTHESIS!!!\n",
						i, l_image->comps[i].dy);
				}
			}
		}
#endif /* USE_JPWL */
		l_img_comp->resno_decoded = 0;								/* number of resolution decoded */
		l_img_comp->factor = l_cp->m_specific_param.m_dec.m_reduce; /* reducing factor per component */
		++l_img_comp;
	}

	/* Compute the number of tiles */
	l_cp->tw = int_ceildiv(l_image->x1 - l_cp->tx0, l_cp->tdx);
	l_cp->th = int_ceildiv(l_image->y1 - l_cp->ty0, l_cp->tdy);
	l_nb_tiles = l_cp->tw * l_cp->th;

	/* Define the tiles which will be decoded */
	if (p_j2k->m_specific_param.m_decoder.m_discard_tiles) {
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = (p_j2k->m_specific_param.m_decoder.m_start_tile_x - l_cp->tx0) / l_cp->tdx;
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = (p_j2k->m_specific_param.m_decoder.m_start_tile_y - l_cp->ty0) / l_cp->tdy;
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = int_ceildiv((p_j2k->m_specific_param.m_decoder.m_end_tile_x - l_cp->tx0), l_cp->tdx);
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = int_ceildiv((p_j2k->m_specific_param.m_decoder.m_end_tile_y - l_cp->ty0), l_cp->tdy);
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;
	}

#ifdef USE_JPWL
	if (l_cp->correct) {
		/* if JPWL is on, we check whether TX errors have damaged
		  too much the SIZ parameters */
		if ((l_cp->tw < 1) || (l_cp->th < 1) || (l_cp->tw > l_cp->max_tiles) || (l_cp->th > l_cp->max_tiles)) {
			opj_event_msg_v2(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
				"JPWL: bad number of tiles (%d x %d)\n",
				l_cp->tw, l_cp->th);
			if (!JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
			/* we try to correct */
			opj_event_msg_v2(p_manager, EVT_WARNING, "- trying to adjust them\n");
			if (l_cp->tw < 1) {
				l_cp->tw= 1;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- setting %d tiles in x => HYPOTHESIS!!!\n",
						l_cp->tw);
			}
			if (l_cp->tw > l_cp->max_tiles) {
				l_cp->tw= 1;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- too large x, increase expectance of %d\n"
					"- setting %d tiles in x => HYPOTHESIS!!!\n",
					l_cp->max_tiles, l_cp->tw);
			}
			if (l_cp->th < 1) {
				l_cp->th= 1;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- setting %d tiles in y => HYPOTHESIS!!!\n",
						l_cp->th);
			}
			if (l_cp->th > l_cp->max_tiles) {
				l_cp->th= 1;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- too large y, increase expectance of %d to continue\n",
					"- setting %d tiles in y => HYPOTHESIS!!!\n",
					l_cp->max_tiles, l_cp->th);
			}
		}
	}
#endif /* USE_JPWL */

	/* memory allocations */
	l_cp->tcps = (opj_tcp_v2_t*) opj_calloc(l_nb_tiles, sizeof(opj_tcp_v2_t));
	if (l_cp->tcps == 00) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}
	memset(l_cp->tcps,0,l_nb_tiles*sizeof(opj_tcp_t));

#ifdef USE_JPWL
	if (l_cp->correct) {
		if (!l_cp->tcps) {
			opj_event_msg_v2(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
				"JPWL: could not alloc tcps field of cp\n");
			if (!JPWL_ASSUME || JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
		}
	}
#endif /* USE_JPWL */

	p_j2k->m_specific_param.m_decoder.m_default_tcp->tccps =
			(opj_tccp_t*) opj_calloc(l_image->numcomps, sizeof(opj_tccp_t));
	if(p_j2k->m_specific_param.m_decoder.m_default_tcp->tccps  == 00) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}
	memset(p_j2k->m_specific_param.m_decoder.m_default_tcp->tccps ,0,l_image->numcomps*sizeof(opj_tccp_t));

	p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mct_records =
			(opj_mct_data_t*)opj_malloc(J2K_MCT_DEFAULT_NB_RECORDS * sizeof(opj_mct_data_t));

	if (! p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mct_records) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}
	memset(p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mct_records,0,J2K_MCT_DEFAULT_NB_RECORDS * sizeof(opj_mct_data_t));
	p_j2k->m_specific_param.m_decoder.m_default_tcp->m_nb_max_mct_records = J2K_MCT_DEFAULT_NB_RECORDS;

	p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mcc_records =
			(opj_simple_mcc_decorrelation_data_t*)
			opj_malloc(J2K_MCC_DEFAULT_NB_RECORDS * sizeof(opj_simple_mcc_decorrelation_data_t));

	if (! p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mcc_records) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}
	memset(p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mcc_records,0,J2K_MCC_DEFAULT_NB_RECORDS * sizeof(opj_simple_mcc_decorrelation_data_t));
	p_j2k->m_specific_param.m_decoder.m_default_tcp->m_nb_max_mcc_records = J2K_MCC_DEFAULT_NB_RECORDS;

	/* set up default dc level shift */
	for (i=0;i<l_image->numcomps;++i) {
		if (! l_image->comps[i].sgnd) {
			p_j2k->m_specific_param.m_decoder.m_default_tcp->tccps[i].m_dc_level_shift = 1 << (l_image->comps[i].prec - 1);
		}
	}

	l_current_tile_param = l_cp->tcps;
	for	(i = 0; i < l_nb_tiles; ++i) {
		l_current_tile_param->tccps = (opj_tccp_t*) opj_malloc(l_image->numcomps * sizeof(opj_tccp_t));
		if (l_current_tile_param->tccps == 00) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
			return OPJ_FALSE;
		}
		memset(l_current_tile_param->tccps,0,l_image->numcomps * sizeof(opj_tccp_t));

		++l_current_tile_param;
	}

	p_j2k->m_specific_param.m_decoder.m_state =  J2K_STATE_MH; /* FIXME J2K_DEC_STATE_MH; */
	opj_image_comp_header_update(l_image,l_cp);

	return OPJ_TRUE;
}